

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CInstIterNext(CInstIter *pIter)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  int io;
  int ic;
  int ip;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter->iStart = -1;
  pIter->iEnd = -1;
  iVar2 = pIter->iInst;
  iVar1 = 0;
  if (iVar2 < pIter->nInst) {
    do {
      local_3c = -0x55555556;
      local_40 = -0x55555556;
      local_44 = -0x55555556;
      iVar1 = (*pIter->pApi->xInst)(pIter->pFts,iVar2,&local_3c,&local_40,&local_44);
      iVar2 = local_44;
      if (iVar1 != 0) goto LAB_001f1459;
      if (local_40 == pIter->iCol) {
        iVar1 = (*pIter->pApi->xPhraseSize)(pIter->pFts,local_3c);
        iVar2 = iVar1 + iVar2 + -1;
        if (pIter->iStart < 0) {
          pIter->iStart = local_44;
        }
        else {
          if (pIter->iEnd < local_44) break;
          if (iVar2 <= pIter->iEnd) goto LAB_001f1447;
        }
        pIter->iEnd = iVar2;
      }
LAB_001f1447:
      iVar2 = pIter->iInst + 1;
      pIter->iInst = iVar2;
    } while (iVar2 < pIter->nInst);
    iVar1 = 0;
  }
LAB_001f1459:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int fts5CInstIterNext(CInstIter *pIter){
  int rc = SQLITE_OK;
  pIter->iStart = -1;
  pIter->iEnd = -1;

  while( rc==SQLITE_OK && pIter->iInst<pIter->nInst ){
    int ip; int ic; int io;
    rc = pIter->pApi->xInst(pIter->pFts, pIter->iInst, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      if( ic==pIter->iCol ){
        int iEnd = io - 1 + pIter->pApi->xPhraseSize(pIter->pFts, ip);
        if( pIter->iStart<0 ){
          pIter->iStart = io;
          pIter->iEnd = iEnd;
        }else if( io<=pIter->iEnd ){
          if( iEnd>pIter->iEnd ) pIter->iEnd = iEnd;
        }else{
          break;
        }
      }
      pIter->iInst++;
    }
  }

  return rc;
}